

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O3

int file_close(archive *a,void *client_data)

{
  free(client_data);
  return 0;
}

Assistant:

static int
file_close(struct archive *a, void *client_data)
{
	struct write_file_data	*mine = (struct write_file_data *)client_data;

	(void)a; /* UNUSED */
	close(mine->fd);
	archive_mstring_clean(&mine->filename);
	free(mine);
	return (ARCHIVE_OK);
}